

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeList.h
# Opt level: O3

CNodeType * __thiscall
Refal2::CNodeList<Refal2::COperation>::InsertBefore
          (CNodeList<Refal2::COperation> *this,CNodeType *nodeBefore,COperation *value)

{
  CNode<Refal2::COperation> *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  CNode<Refal2::COperation> **ppCVar4;
  CNodeType *pCVar3;
  
  if (nodeBefore != (CNodeType *)0x0) {
    iVar2 = (*this->_vptr_CNodeList[3])(this,value);
    pCVar3 = (CNodeType *)CONCAT44(extraout_var,iVar2);
    pCVar3->next = nodeBefore;
    pCVar1 = nodeBefore->prev;
    pCVar3->prev = pCVar1;
    ppCVar4 = &pCVar1->next;
    if (this->first == nodeBefore) {
      ppCVar4 = &this->first;
    }
    *ppCVar4 = pCVar3;
    nodeBefore->prev = pCVar3;
    return pCVar3;
  }
  __assert_fail("nodeBefore != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/NodeList.h"
                ,0xb8,
                "typename CNodeList<T>::CNodeType *Refal2::CNodeList<Refal2::COperation>::InsertBefore(CNodeType *, const T &) [T = Refal2::COperation]"
               );
}

Assistant:

typename CNodeList<T>::CNodeType* CNodeList<T>::InsertBefore(
	CNodeType* nodeBefore, const T& value )
{
	assert( nodeBefore != nullptr );
	CNodeType* newNode = Alloc( value );
	newNode->next = nodeBefore;
	newNode->prev = nodeBefore->prev;
	if( nodeBefore == first ) {
		first = newNode;
	} else {
		nodeBefore->prev->next = newNode;
	}
	nodeBefore->prev = newNode;

	return newNode;
}